

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HullFinder.cpp
# Opt level: O3

SelectionSet * __thiscall
OpenMD::HullFinder::findHull(SelectionSet *__return_storage_ptr__,HullFinder *this,int param_1)

{
  vector<int,_std::allocator<int>_> local_28;
  
  std::vector<int,_std::allocator<int>_>::vector(&local_28,&this->nObjects_);
  SelectionSet::SelectionSet(__return_storage_ptr__,&local_28);
  if (local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  memcpy(&painCave,
         "HullFinder : Hull calculation is not possible without libqhull.\n\tPlease rebuild OpenMD with qhull enabled."
         ,0x6b);
  painCave.isFatal = 1;
  painCave.severity = 1;
  simError();
  return __return_storage_ptr__;
}

Assistant:

SelectionSet HullFinder::findHull(int) {
    SelectionSet ssResult(nObjects_);
#ifdef HAVE_QHULL
    surfaceMesh_->computeHull(localSites_);
    std::vector<Triangle> sMesh = surfaceMesh_->getMesh();
    // Loop over the mesh faces
    std::vector<Triangle>::iterator face;
    std::vector<StuntDouble*>::iterator vertex;

    // This will work in parallel because the triangles returned by the mesh
    // have a NULL stuntDouble if this processor doesn't own the

    for (face = sMesh.begin(); face != sMesh.end(); ++face) {
      Triangle thisTriangle               = *face;
      std::vector<StuntDouble*> vertexSDs = thisTriangle.getVertices();
      for (vertex = vertexSDs.begin(); vertex != vertexSDs.end(); ++vertex) {
        if ((*vertex) != NULL) {
          ssResult.bitsets_[STUNTDOUBLE].setBitOn((*vertex)->getGlobalIndex());
        }
      }
    }
    surfaceArea_ = surfaceMesh_->getArea();
    volume_      = surfaceMesh_->getVolume();

#else
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "HullFinder : Hull calculation is not possible without libqhull.\n"
             "\tPlease rebuild OpenMD with qhull enabled.");
    painCave.severity = OPENMD_ERROR;
    painCave.isFatal  = 1;
    simError();
#endif

    return ssResult;
  }